

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_stream_get_latency(cubeb_stream_conflict *stm,uint32_t *latency)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  pa_usec_t r_usec;
  int negative;
  
  iVar3 = -1;
  if ((stm != (cubeb_stream_conflict *)0x0) && (stm->output_stream != (pa_stream *)0x0)) {
    iVar2 = (*cubeb_pa_stream_get_latency)(stm->output_stream,&r_usec,&negative);
    if (iVar2 == 0) {
      iVar3 = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (stm->output_sample_spec).rate * r_usec;
      *latency = SUB164(auVar1 / ZEXT816(1000000),0);
    }
  }
  return iVar3;
}

Assistant:

static int
pulse_stream_get_latency(cubeb_stream * stm, uint32_t * latency)
{
  pa_usec_t r_usec;
  int negative, r;

  if (!stm || !stm->output_stream) {
    return CUBEB_ERROR;
  }

  r = WRAP(pa_stream_get_latency)(stm->output_stream, &r_usec, &negative);
  assert(!negative);
  if (r) {
    return CUBEB_ERROR;
  }

  *latency = r_usec * stm->output_sample_spec.rate / PA_USEC_PER_SEC;
  return CUBEB_OK;
}